

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

void Sto_ManDumpClauses(Sto_Man_t *p,char *pFileName)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  uint uVar3;
  Sto_Cls_t *pSVar4;
  ulong uVar5;
  
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"p %d %d %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses,
            (ulong)(uint)p->nRoots,(ulong)(uint)p->nClausesA);
    pSVar4 = (Sto_Cls_t *)&p->pHead;
    while (pSVar4 = pSVar4->pNext, pSVar4 != (Sto_Cls_t *)0x0) {
      for (uVar5 = 0; uVar5 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff); uVar5 = uVar5 + 1) {
        uVar1 = *(uint *)((long)&pSVar4[1].pNext + uVar5 * 4);
        uVar3 = (int)uVar1 >> 1;
        uVar2 = ~uVar3;
        if ((uVar1 & 1) == 0) {
          uVar2 = uVar3 + 1;
        }
        fprintf(__stream," %d",(ulong)uVar2);
      }
      fwrite(" 0\n",3,1,__stream);
    }
    fclose(__stream);
    return;
  }
  printf("Error: Cannot open output file (%s).\n",pFileName);
  return;
}

Assistant:

void Sto_ManDumpClauses( Sto_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Sto_Cls_t * pClause;
    int i;
    // start the file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Error: Cannot open output file (%s).\n", pFileName );
        return;
    }
    // write the data
    fprintf( pFile, "p %d %d %d %d\n", p->nVars, p->nClauses, p->nRoots, p->nClausesA );
    Sto_ManForEachClause( p, pClause )
    {
        for ( i = 0; i < (int)pClause->nLits; i++ )
            fprintf( pFile, " %d", lit_print(pClause->pLits[i]) );
        fprintf( pFile, " 0\n" );
    }
//    fprintf( pFile, " 0\n" );
    fclose( pFile );
}